

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * svariable(char *name,char *cur,char **storage,identfun fun,int flags)

{
  char *pcVar1;
  ident local_70;
  int local_2c;
  identfun p_Stack_28;
  int flags_local;
  identfun fun_local;
  char **storage_local;
  char *cur_local;
  char *name_local;
  
  local_2c = flags;
  p_Stack_28 = fun;
  fun_local = (identfun)storage;
  storage_local = (char **)cur;
  cur_local = name;
  ident::ident(&local_70,2,name,storage,fun,flags);
  addident(&local_70);
  pcVar1 = newstring((char *)storage_local);
  return pcVar1;
}

Assistant:

char *svariable(const char *name, const char *cur, char **storage, identfun fun, int flags)
{
    addident(ident(ID_SVAR, name, storage, (void *)fun, flags));
    return newstring(cur);
}